

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# segments.cpp
# Opt level: O3

ssize_t __thiscall r_comp::Metadata::write(Metadata *this,int __fd,void *__buf,size_t __n)

{
  pointer pCVar1;
  ushort uVar2;
  Class *pCVar3;
  size_t sVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  pointer pbVar6;
  pointer __n_00;
  void *__buf_00;
  long lVar7;
  _Hash_node_base *p_Var8;
  undefined4 in_register_00000034;
  int *piVar9;
  size_t sVar10;
  pointer pbVar11;
  long lVar12;
  
  piVar9 = (int *)CONCAT44(in_register_00000034,__fd);
  pCVar1 = (this->classes_by_opcodes).m_vector.
           super__Vector_base<r_comp::Class,_std::allocator<r_comp::Class>_>._M_impl.
           super__Vector_impl_data._M_finish;
  __n_00 = (this->classes_by_opcodes).m_vector.
           super__Vector_base<r_comp::Class,_std::allocator<r_comp::Class>_>._M_impl.
           super__Vector_impl_data._M_start;
  *piVar9 = (int)((ulong)((long)pCVar1 - (long)__n_00) >> 3) * 0x38e38e39;
  if (pCVar1 == __n_00) {
    lVar12 = 1;
  }
  else {
    lVar12 = 1;
    sVar10 = 0;
    do {
      pCVar3 = r_code::vector<r_comp::Class>::operator[](&this->classes_by_opcodes,sVar10);
      Class::write(pCVar3,(int)lVar12 * 4 + __fd,__buf_00,(size_t)__n_00);
      pCVar3 = r_code::vector<r_comp::Class>::operator[](&this->classes_by_opcodes,sVar10);
      sVar4 = Class::get_size(pCVar3);
      lVar12 = lVar12 + sVar4;
      sVar10 = sVar10 + 1;
    } while (sVar10 < (ulong)(((long)(this->classes_by_opcodes).m_vector.
                                     super__Vector_base<r_comp::Class,_std::allocator<r_comp::Class>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(this->classes_by_opcodes).m_vector.
                                     super__Vector_base<r_comp::Class,_std::allocator<r_comp::Class>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 3) *
                             -0x71c71c71c71c71c7));
  }
  piVar9[lVar12] = (int)(this->classes)._M_h._M_element_count;
  for (p_Var8 = (this->classes)._M_h._M_before_begin._M_nxt; lVar7 = lVar12 + 1,
      p_Var8 != (_Hash_node_base *)0x0; p_Var8 = p_Var8->_M_nxt) {
    r_code::WriteString((uint *)(piVar9 + lVar7),(string *)(p_Var8 + 1));
    lVar12 = r_code::GetStringSize((string *)(p_Var8 + 1));
    lVar12 = lVar12 + lVar7;
    uVar2 = r_code::Atom::asOpcode();
    piVar9[lVar12] = (uint)uVar2;
  }
  lVar12 = lVar12 + 2;
  piVar9[lVar7] = (int)(this->sys_classes)._M_h._M_element_count;
  for (p_Var8 = (this->sys_classes)._M_h._M_before_begin._M_nxt; p_Var8 != (_Hash_node_base *)0x0;
      p_Var8 = p_Var8->_M_nxt) {
    r_code::WriteString((uint *)(piVar9 + lVar12),(string *)(p_Var8 + 1));
    lVar7 = r_code::GetStringSize((string *)(p_Var8 + 1));
    uVar2 = r_code::Atom::asOpcode();
    piVar9[lVar7 + lVar12] = (uint)uVar2;
    lVar12 = lVar12 + lVar7 + 1;
  }
  pbVar6 = (this->class_names).m_vector.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pbVar11 = (this->class_names).m_vector.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  lVar7 = lVar12 + 1;
  piVar9[lVar12] = (int)((ulong)((long)pbVar6 - (long)pbVar11) >> 5);
  if (pbVar6 != pbVar11) {
    sVar10 = 0;
    do {
      pbVar5 = r_code::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator[](&this->class_names,sVar10);
      r_code::WriteString((uint *)(piVar9 + lVar7),(string *)pbVar5);
      pbVar5 = r_code::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator[](&this->class_names,sVar10);
      lVar12 = r_code::GetStringSize((string *)pbVar5);
      lVar7 = lVar7 + lVar12;
      sVar10 = sVar10 + 1;
    } while (sVar10 < (ulong)((long)(this->class_names).m_vector.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(this->class_names).m_vector.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 5));
  }
  pbVar6 = (this->operator_names).m_vector.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pbVar11 = (this->operator_names).m_vector.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  lVar12 = lVar7 + 1;
  piVar9[lVar7] = (int)((ulong)((long)pbVar6 - (long)pbVar11) >> 5);
  if (pbVar6 != pbVar11) {
    sVar10 = 0;
    do {
      pbVar5 = r_code::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator[](&this->operator_names,sVar10);
      r_code::WriteString((uint *)(piVar9 + lVar12),(string *)pbVar5);
      pbVar5 = r_code::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator[](&this->operator_names,sVar10);
      lVar7 = r_code::GetStringSize((string *)pbVar5);
      lVar12 = lVar12 + lVar7;
      sVar10 = sVar10 + 1;
    } while (sVar10 < (ulong)((long)(this->operator_names).m_vector.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(this->operator_names).m_vector.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 5));
  }
  pbVar6 = (this->function_names).m_vector.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pbVar11 = (this->function_names).m_vector.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  piVar9[lVar12] = (int)((ulong)((long)pbVar6 - (long)pbVar11) >> 5);
  if (pbVar6 != pbVar11) {
    lVar12 = lVar12 + 1;
    pbVar11 = (pointer)0x0;
    do {
      pbVar5 = r_code::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator[](&this->function_names,(size_t)pbVar11);
      r_code::WriteString((uint *)(piVar9 + lVar12),(string *)pbVar5);
      pbVar5 = r_code::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator[](&this->function_names,(size_t)pbVar11);
      lVar7 = r_code::GetStringSize((string *)pbVar5);
      lVar12 = lVar12 + lVar7;
      pbVar11 = (pointer)((long)&(pbVar11->_M_dataplus)._M_p + 1);
      pbVar6 = (pointer)((long)(this->function_names).m_vector.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(this->function_names).m_vector.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 5);
    } while (pbVar11 < pbVar6);
  }
  return (ssize_t)pbVar6;
}

Assistant:

void Metadata::write(uint32_t *data)
{
    data[0] = classes_by_opcodes.size();
    size_t i;
    size_t offset = 1;

    for (i = 0; i < classes_by_opcodes.size(); ++i) {
        classes_by_opcodes[i].write(data + offset);
        offset += classes_by_opcodes[i].get_size();
    }

    data[offset++] = classes.size();
    std::unordered_map<std::string, Class>::iterator it = classes.begin();

    for (; it != classes.end(); ++it) {
        r_code::WriteString(data + offset, it->first);
        offset += r_code::GetStringSize(it->first);
        data[offset] = it->second.atom.asOpcode();
        offset++;
    }

    data[offset++] = sys_classes.size();
    it = sys_classes.begin();

    for (; it != sys_classes.end(); ++it) {
        r_code::WriteString(data + offset, it->first);
        offset += r_code::GetStringSize(it->first);
        data[offset] = it->second.atom.asOpcode();
        offset++;
    }

    data[offset++] = class_names.size();

    for (i = 0; i < class_names.size(); ++i) {
        r_code::WriteString(data + offset, class_names[i]);
        offset += r_code::GetStringSize(class_names[i]);
    }

    data[offset++] = operator_names.size();

    for (i = 0; i < operator_names.size(); ++i) {
        r_code::WriteString(data + offset, operator_names[i]);
        offset += r_code::GetStringSize(operator_names[i]);
    }

    data[offset++] = function_names.size();

    for (i = 0; i < function_names.size(); ++i) {
        r_code::WriteString(data + offset, function_names[i]);
        offset += r_code::GetStringSize(function_names[i]);
    }
}